

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

String * __thiscall LiteScript::Character::operator*=(Character *this,uint nb)

{
  String *pSVar1;
  bool bVar2;
  String res;
  String cpy;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_60;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = L'\0';
  String::String((String *)&local_40,(this->str->str)._M_dataplus._M_p[this->i]);
  while (bVar2 = nb != 0, nb = nb - 1, bVar2) {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&local_60,&local_40);
  }
  String::Replace(this->str,this->i,(String *)&local_60);
  pSVar1 = this->str;
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  std::__cxx11::u32string::~u32string((u32string *)&local_60);
  return pSVar1;
}

Assistant:

LiteScript::String& LiteScript::Character::operator*=(unsigned int nb) {
    String res, cpy(this->str[this->i]);
    for (unsigned int j = 0; j < nb; j++)
        res += cpy;
    this->str.Replace(this->i, res);
    return this->str;
}